

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCM_Parser.cpp
# Opt level: O0

h__WAVParser * __thiscall
ASDCP::PCM::WAVParser::h__WAVParser::OpenRead
          (h__WAVParser *this,string *filename,Rational *PictureRate)

{
  int iVar1;
  ui32_t uVar2;
  Rational *in_RCX;
  SimpleRF64Header local_2a8 [3];
  Result_t local_240 [104];
  undefined1 local_1d8 [8];
  SimpleRF64Header RF64Header;
  SimpleAIFFHeader local_1b0 [4];
  Result_t local_148 [104];
  undefined1 local_e0 [8];
  SimpleAIFFHeader AIFFHeader;
  SimpleWaveHeader local_c0 [4];
  undefined1 local_54 [8];
  SimpleWaveHeader WavHeader;
  Rational *PictureRate_local;
  string *filename_local;
  h__WAVParser *this_local;
  Result_t *result;
  
  Kumu::FileReader::OpenRead((string *)this);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    Wav::SimpleWaveHeader::SimpleWaveHeader((SimpleWaveHeader *)local_54);
    Wav::SimpleWaveHeader::ReadFromFile(local_c0,(IFileReader *)local_54,(ui32_t *)filename);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_c0);
    Kumu::Result_t::~Result_t((Result_t *)local_c0);
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar1 < 0) {
      AIFF::SimpleAIFFHeader::SimpleAIFFHeader((SimpleAIFFHeader *)local_e0);
      Kumu::FileReader::Seek((long)local_148,(SeekPos_t)filename);
      Kumu::Result_t::~Result_t(local_148);
      AIFF::SimpleAIFFHeader::ReadFromFile(local_1b0,(IFileReader *)local_e0,(ui32_t *)filename);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_1b0);
      Kumu::Result_t::~Result_t((Result_t *)local_1b0);
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (iVar1 < 0) {
        RF64::SimpleRF64Header::SimpleRF64Header((SimpleRF64Header *)local_1d8);
        Kumu::FileReader::Seek((long)local_240,(SeekPos_t)filename);
        Kumu::Result_t::~Result_t(local_240);
        RF64::SimpleRF64Header::ReadFromFile(local_2a8,(IFileReader *)local_1d8,(ui32_t *)filename);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_2a8);
        Kumu::Result_t::~Result_t((Result_t *)local_2a8);
        iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
        if (-1 < iVar1) {
          RF64::SimpleRF64Header::FillADesc
                    ((SimpleRF64Header *)local_1d8,
                     (AudioDescriptor *)((long)&filename[2].field_2 + 8),*in_RCX);
          uVar2 = CalcFrameBufferSize((AudioDescriptor *)((long)&filename[2].field_2 + 8));
          *(ui32_t *)&filename[2]._M_string_length = uVar2;
          *(undefined8 *)((long)&filename[1].field_2 + 8) = RF64Header._16_8_;
          *(int *)(filename + 4) =
               (int)(*(ulong *)((long)&filename[1].field_2 + 8) /
                    (ulong)(uint)filename[2]._M_string_length);
          *(undefined4 *)&filename[4].field_0x4 = 0;
          Reset((h__WAVParser *)filename);
        }
      }
      else {
        RF64Header.data_len = *(ui64_t *)in_RCX;
        AIFF::SimpleAIFFHeader::FillADesc
                  ((SimpleAIFFHeader *)local_e0,(AudioDescriptor *)((long)&filename[2].field_2 + 8),
                   (Rational)RF64Header.data_len);
        uVar2 = CalcFrameBufferSize((AudioDescriptor *)((long)&filename[2].field_2 + 8));
        *(ui32_t *)&filename[2]._M_string_length = uVar2;
        *(ulong *)((long)&filename[1].field_2 + 8) = (ulong)(uint)AIFFHeader.sampleRate._2_4_;
        *(int *)(filename + 4) =
             (int)(*(ulong *)((long)&filename[1].field_2 + 8) /
                  (ulong)(uint)filename[2]._M_string_length);
        *(undefined4 *)&filename[4].field_0x4 = 0;
        Reset((h__WAVParser *)filename);
      }
    }
    else {
      AIFFHeader._16_8_ = *in_RCX;
      Wav::SimpleWaveHeader::FillADesc
                ((SimpleWaveHeader *)local_54,(AudioDescriptor *)((long)&filename[2].field_2 + 8),
                 (Rational)AIFFHeader._16_8_);
      uVar2 = CalcFrameBufferSize((AudioDescriptor *)((long)&filename[2].field_2 + 8));
      *(ui32_t *)&filename[2]._M_string_length = uVar2;
      *(ulong *)((long)&filename[1].field_2 + 8) = (ulong)(uint)WavHeader._12_4_;
      *(int *)(filename + 4) =
           (int)(*(ulong *)((long)&filename[1].field_2 + 8) /
                (ulong)(uint)filename[2]._M_string_length);
      *(undefined4 *)&filename[4].field_0x4 = 0;
      Reset((h__WAVParser *)filename);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::WAVParser::h__WAVParser::OpenRead(const std::string& filename, const Rational& PictureRate)
{
  Result_t result = m_FileReader.OpenRead(filename);

  if ( ASDCP_SUCCESS(result) )
    {
      SimpleWaveHeader WavHeader;
      result = WavHeader.ReadFromFile(m_FileReader, &m_DataStart);
  
      if ( ASDCP_SUCCESS(result) )
	{
	  WavHeader.FillADesc(m_ADesc, PictureRate);
	  m_FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(m_ADesc);
	  m_DataLength = WavHeader.data_len;
	  m_ADesc.ContainerDuration = m_DataLength / m_FrameBufferSize;
	  m_ADesc.ChannelFormat = PCM::CF_NONE;
	  Reset();
	}
      else
	{
	  ASDCP::AIFF::SimpleAIFFHeader AIFFHeader;
	  m_FileReader.Seek(0);

      result = AIFFHeader.ReadFromFile(m_FileReader, &m_DataStart);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      AIFFHeader.FillADesc(m_ADesc, PictureRate);
	      m_FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(m_ADesc);
	      m_DataLength = AIFFHeader.data_len;
	      m_ADesc.ContainerDuration = m_DataLength / m_FrameBufferSize;
	      m_ADesc.ChannelFormat = PCM::CF_NONE;
	      Reset();
	    }
	  else
	    {
	      SimpleRF64Header RF64Header;
	      m_FileReader.Seek(0);
          result = RF64Header.ReadFromFile(m_FileReader, &m_DataStart);

	      if ( ASDCP_SUCCESS(result) )
		{
		  RF64Header.FillADesc(m_ADesc, PictureRate);
		  m_FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(m_ADesc);
		  m_DataLength = RF64Header.data_len;
		  m_ADesc.ContainerDuration = m_DataLength / m_FrameBufferSize;
		  m_ADesc.ChannelFormat = PCM::CF_NONE;
		  Reset();
		}
	    }
	}
    }

  return result;
}